

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::Finalize(Cluster *this,bool set_last_frame_duration,uint64_t duration)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int32 iVar7;
  reference ppFVar8;
  _Self *p_Var9;
  uint64_t uVar10;
  size_type sVar11;
  uint64_t uVar12;
  mapped_type *pmVar13;
  mapped_type *this_00;
  undefined4 extraout_var;
  long in_RDX;
  byte in_SIL;
  Cluster *in_RDI;
  int64_t pos;
  bool wrote_frame;
  FrameMapIterator frames_iterator;
  Frame *frame;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *in_stack_ffffffffffffff18;
  Cluster *in_stack_ffffffffffffff20;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *in_stack_ffffffffffffff28;
  Frame *in_stack_ffffffffffffff30;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *in_stack_ffffffffffffff38;
  Frame *in_stack_ffffffffffffff40;
  Cluster *in_stack_ffffffffffffff48;
  Cluster *in_stack_ffffffffffffff58;
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  *in_stack_ffffffffffffff60;
  byte local_91;
  _Self local_48;
  _Base_ptr local_40;
  _Self local_38;
  _Base_ptr local_30;
  Cluster *local_28;
  long local_20;
  byte local_11;
  bool local_1;
  
  iVar7 = (int32)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_11 = in_SIL & 1;
  if ((in_RDI->writer_ == (IMkvWriter *)0x0) || ((in_RDI->finalized_ & 1U) != 0)) {
    local_1 = false;
  }
  else {
    local_20 = in_RDX;
    if ((in_RDI->write_last_frame_with_duration_ & 1U) == 0) {
LAB_00178921:
      if (in_RDI->size_position_ == -1) {
        local_1 = false;
      }
      else {
        uVar4 = (*in_RDI->writer_->_vptr_IMkvWriter[3])();
        if ((uVar4 & 1) != 0) {
          iVar5 = (*in_RDI->writer_->_vptr_IMkvWriter[1])();
          iVar6 = (*in_RDI->writer_->_vptr_IMkvWriter[2])(in_RDI->writer_,in_RDI->size_position_);
          if (iVar6 != 0) {
            return false;
          }
          payload_size(in_RDI);
          iVar7 = WriteUIntSize((IMkvWriter *)in_stack_ffffffffffffff38,
                                (uint64)in_stack_ffffffffffffff30,iVar7);
          if (iVar7 != 0) {
            return false;
          }
          iVar5 = (*in_RDI->writer_->_vptr_IMkvWriter[2])
                            (in_RDI->writer_,CONCAT44(extraout_var,iVar5));
          if (iVar5 != 0) {
            return false;
          }
        }
        in_RDI->finalized_ = true;
        local_1 = true;
      }
    }
    else {
      do {
        bVar2 = std::
                map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                ::empty((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                         *)0x1785d1);
        iVar7 = (int32)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_00178921;
        local_30 = (_Base_ptr)
                   std::
                   map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                   ::begin(in_stack_ffffffffffffff18);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                      *)0x1785ff);
        ppFVar8 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                            ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                             in_stack_ffffffffffffff20);
        local_28 = (Cluster *)*ppFVar8;
        local_40 = (_Base_ptr)
                   std::
                   map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                   ::begin(in_stack_ffffffffffffff18);
        p_Var9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                 ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                               *)in_stack_ffffffffffffff20);
        local_38._M_node = p_Var9->_M_node;
        while( true ) {
          local_48._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
               ::end(in_stack_ffffffffffffff18);
          bVar2 = std::operator!=(&local_38,&local_48);
          if (!bVar2) break;
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                        *)0x178682);
          ppFVar8 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::front
                              ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                               in_stack_ffffffffffffff20);
          uVar12 = Frame::timestamp(*ppFVar8);
          uVar10 = Frame::timestamp((Frame *)local_28);
          if (uVar12 < uVar10) {
            std::
            _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                          *)0x1786c2);
            ppFVar8 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::
                      front((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                            in_stack_ffffffffffffff20);
            local_28 = (Cluster *)*ppFVar8;
          }
          std::
          _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>
                        *)in_stack_ffffffffffffff20);
        }
        local_91 = 0;
        if ((local_11 & 1) != 0) {
          in_stack_ffffffffffffff60 = &in_RDI->stored_frames_;
          Frame::track_number((Frame *)local_28);
          std::
          map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
          ::operator[](in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
          sVar11 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::size
                             ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                              in_stack_ffffffffffffff20);
          local_91 = 0;
          if (sVar11 == 1) {
            bVar2 = Frame::duration_set((Frame *)local_28);
            local_91 = bVar2 ^ 0xff;
          }
        }
        lVar1 = local_20;
        if ((local_91 & 1) != 0) {
          in_stack_ffffffffffffff58 = local_28;
          uVar12 = Frame::timestamp((Frame *)local_28);
          Frame::set_duration((Frame *)in_stack_ffffffffffffff58,lVar1 - uVar12);
          bVar2 = Frame::is_key((Frame *)local_28);
          if ((!bVar2) && (bVar2 = Frame::reference_block_timestamp_set((Frame *)local_28), !bVar2))
          {
            in_stack_ffffffffffffff40 = (Frame *)&in_RDI->last_block_timestamp_;
            in_stack_ffffffffffffff48 = local_28;
            Frame::track_number((Frame *)local_28);
            pmVar13 = std::
                      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                    *)in_stack_ffffffffffffff60,
                                   (key_type *)in_stack_ffffffffffffff58);
            Frame::set_reference_block_timestamp((Frame *)in_stack_ffffffffffffff48,*pmVar13);
          }
        }
        bVar2 = DoWriteFrame(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff30 = (Frame *)&in_RDI->stored_frames_;
        Frame::track_number((Frame *)local_28);
        std::
        map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
        ::operator[](in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
        std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::pop_front
                  ((list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_> *)
                   in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff38 = &in_RDI->stored_frames_;
        Frame::track_number((Frame *)local_28);
        this_00 = std::
                  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                  ::operator[](in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
        bVar3 = std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>::empty
                          (this_00);
        if (bVar3) {
          in_stack_ffffffffffffff28 = &in_RDI->stored_frames_;
          Frame::track_number((Frame *)local_28);
          std::
          map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
          ::erase((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
                   *)in_stack_ffffffffffffff20,(key_type *)in_stack_ffffffffffffff18);
        }
        in_stack_ffffffffffffff20 = local_28;
        if (local_28 != (Cluster *)0x0) {
          Frame::~Frame(in_stack_ffffffffffffff30);
          operator_delete(in_stack_ffffffffffffff20);
        }
      } while (bVar2);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Cluster::Finalize(bool set_last_frame_duration, uint64_t duration) {
  if (!writer_ || finalized_)
    return false;

  if (write_last_frame_with_duration_) {
    // Write out held back Frames. This essentially performs a k-way merge
    // across all tracks in the increasing order of timestamps.
    while (!stored_frames_.empty()) {
      Frame* frame = stored_frames_.begin()->second.front();

      // Get the next frame to write (frame with least timestamp across all
      // tracks).
      for (FrameMapIterator frames_iterator = ++stored_frames_.begin();
           frames_iterator != stored_frames_.end(); ++frames_iterator) {
        if (frames_iterator->second.front()->timestamp() < frame->timestamp()) {
          frame = frames_iterator->second.front();
        }
      }

      // Set the duration if it's the last frame for the track.
      if (set_last_frame_duration &&
          stored_frames_[frame->track_number()].size() == 1 &&
          !frame->duration_set()) {
        frame->set_duration(duration - frame->timestamp());
        if (!frame->is_key() && !frame->reference_block_timestamp_set()) {
          frame->set_reference_block_timestamp(
              last_block_timestamp_[frame->track_number()]);
        }
      }

      // Write the frame and remove it from |stored_frames_|.
      const bool wrote_frame = DoWriteFrame(frame);
      stored_frames_[frame->track_number()].pop_front();
      if (stored_frames_[frame->track_number()].empty()) {
        stored_frames_.erase(frame->track_number());
      }
      delete frame;
      if (!wrote_frame)
        return false;
    }
  }

  if (size_position_ == -1)
    return false;

  if (writer_->Seekable()) {
    const int64_t pos = writer_->Position();

    if (writer_->Position(size_position_))
      return false;

    if (WriteUIntSize(writer_, payload_size(), 8))
      return false;

    if (writer_->Position(pos))
      return false;
  }

  finalized_ = true;

  return true;
}